

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O1

bool __thiscall triangle::contains(triangle *this,vec2 *p,float r)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  float fVar4;
  vec2 local_40;
  float local_38;
  
  bVar1 = contains(this,p);
  if (!bVar1) {
    uVar2 = 0;
    do {
      fVar4 = ((float)(int)uVar2 * 0.00390625 + (float)(int)uVar2 * 0.00390625) * 3.1415927;
      local_38 = cosf(fVar4);
      fVar4 = sinf(fVar4);
      bVar3 = bVar1 == false;
      bVar1 = true;
      if (bVar3) {
        local_40.y = fVar4 * r + p->y;
        local_40.x = local_38 * r + p->x;
        bVar1 = contains(this,&local_40);
      }
    } while ((uVar2 < 0xff) && (uVar2 = uVar2 + 1, bVar1 == false));
  }
  return bVar1;
}

Assistant:

bool contains(const dja::vec2 &p, float r) const {
        bool res = contains(p);
        int cnt = 256;

        for (int i = 0; i < cnt && !res; ++i) {
            float u = i / float(cnt);
            float a = u * 2 * M_PI;
            float x = cos(a), y = sin(a);

            res = res || contains(p + r * dja::vec2(x, y));
        }

        return res;
    }